

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t union_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                       uint16_t *output)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  __m128i *palVar4;
  longlong extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong lVar5;
  uint16_t *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  __m128i *palVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t *buffer_00;
  __m128i alVar13;
  __m128i old;
  __m128i old_00;
  __m128i old_01;
  __m128i newval;
  __m128i newval_00;
  __m128i newval_01;
  __m128i newval_02;
  int local_108;
  __m128i vecMax;
  __m128i vecMin;
  __m128i V;
  uint16_t buffer [16];
  __m128i vB;
  __m128i vA;
  longlong extraout_RDX_00;
  longlong extraout_RDX_03;
  
  if (length1 < 8 || length2 < 8) {
    sVar3 = union_uint16(array1,(ulong)length1,array2,(ulong)length2,output);
    return (uint32_t)sVar3;
  }
  vA = (__m128i)vlddqu_avx(*(undefined1 (*) [16])array1);
  alVar13 = (__m128i)vlddqu_avx(*(undefined1 (*) [16])array2);
  palVar10 = &vB;
  palVar4 = &vecMax;
  puVar6 = output;
  vB = alVar13;
  sse_merge(&vA,palVar10,&vecMin,palVar4);
  vpcmpeqd_avx((undefined1  [16])alVar13,(undefined1  [16])alVar13);
  alVar13[1] = (longlong)palVar10;
  alVar13[0] = (longlong)output;
  newval[1] = (longlong)palVar4;
  newval[0] = extraout_RDX;
  iVar1 = store_unique(alVar13,newval,puVar6);
  buffer_00 = output + iVar1;
  palVar4 = (__m128i *)CONCAT71((int7)((ulong)palVar4 >> 8),length2 < 0x10 || length1 < 0x10);
  if (length2 >= 0x10 && length1 >= 0x10) {
    uVar12 = array1[8];
    uVar11 = array2[8];
    uVar7 = 1;
    uVar9 = 1;
    do {
      uVar8 = (uint)uVar9;
      if (uVar11 < uVar12) {
        V = (__m128i)vlddqu_avx(*(undefined1 (*) [16])(array2 + uVar9 * 8));
        uVar8 = uVar8 + 1;
        uVar9 = (ulong)uVar8;
        if (length2 >> 3 <= uVar8) goto LAB_0010242b;
        uVar11 = array2[uVar8 * 8];
      }
      else {
        V = (__m128i)vlddqu_avx(*(undefined1 (*) [16])(array1 + (ulong)uVar7 * 8));
        uVar7 = uVar7 + 1;
        if (length1 >> 3 <= uVar7) goto LAB_0010242b;
        uVar12 = array1[uVar7 * 8];
      }
      palVar4 = &vecMax;
      palVar10 = &vecMax;
      sse_merge(&V,&vecMax,&vecMin,&vecMax);
      old[1] = (longlong)palVar10;
      old[0] = (longlong)buffer_00;
      newval_00[1] = (longlong)palVar4;
      newval_00[0] = extraout_RDX_01;
      iVar1 = store_unique(old,newval_00,puVar6);
      buffer_00 = buffer_00 + iVar1;
    } while( true );
  }
  uVar8 = 8;
  uVar7 = 1;
  lVar5 = extraout_RDX_00;
LAB_0010247d:
  old_01[1] = (longlong)palVar10;
  old_01[0] = (longlong)buffer;
  newval_02[1] = (longlong)palVar4;
  newval_02[0] = lVar5;
  uVar2 = store_unique(old_01,newval_02,puVar6);
  if (uVar7 == length1 >> 3) {
    memcpy(buffer + uVar2,array1 + (length1 & 0xfffffff8),(ulong)((length1 & 7) * 2));
    uVar2 = uVar2 + (length1 & 7);
    qsort(buffer,(ulong)uVar2,2,uint16_compare);
    uVar2 = unique(buffer,uVar2);
    puVar6 = array2 + uVar8;
    uVar8 = length2 - uVar8;
  }
  else {
    memcpy(buffer + uVar2,array2 + uVar8,(ulong)((length2 & 7) * 2));
    uVar2 = uVar2 + (length2 & 7);
    qsort(buffer,(ulong)uVar2,2,uint16_compare);
    uVar2 = unique(buffer,uVar2);
    puVar6 = array1 + uVar7 * 8;
    uVar8 = length1 + uVar7 * -8;
  }
  sVar3 = union_uint16(buffer,(ulong)uVar2,puVar6,(ulong)uVar8,buffer_00);
  local_108 = (int)((ulong)((long)buffer_00 - (long)output) >> 1);
  return (int)sVar3 + local_108;
LAB_0010242b:
  palVar4 = &vecMax;
  palVar10 = palVar4;
  sse_merge(&V,palVar4,&vecMin,palVar4);
  old_00[1] = (longlong)palVar10;
  old_00[0] = (longlong)buffer_00;
  newval_01[1] = (longlong)palVar4;
  newval_01[0] = extraout_RDX_02;
  iVar1 = store_unique(old_00,newval_01,puVar6);
  buffer_00 = buffer_00 + iVar1;
  uVar8 = uVar8 << 3;
  lVar5 = extraout_RDX_03;
  goto LAB_0010247d;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE union algorithm
// This function may not be safe if array1 == output or array2 == output.
uint32_t union_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                        const uint16_t *__restrict__ array2, uint32_t length2,
                        uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return (uint32_t)union_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    output += store_unique(laststore, vecMin, output);
    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            output += store_unique(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        output += store_unique(laststore, vecMin, output);
        laststore = vecMin;
    }
    // we finish the rest off using a scalar algorithm
    // could be improved?
    //
    // copy the small end on a tmp buffer
    uint32_t len = (uint32_t)(output - initoutput);
    uint16_t buffer[16];
    uint32_t leftoversize = store_unique(laststore, vecMax, buffer);
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);

        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array2 + 8 * pos2,
                                      length2 - 8 * pos2, output);
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array1 + 8 * pos1,
                                      length1 - 8 * pos1, output);
    }
    return len;
}